

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O3

void __thiscall Fl_TooltipBox::draw(Fl_TooltipBox *this)

{
  uint uVar1;
  
  Fl_Widget::draw_box((Fl_Widget *)this,FL_BORDER_BOX,0,0,
                      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                      super_Fl_Group.super_Fl_Widget.w_,
                      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                      super_Fl_Group.super_Fl_Widget.h_,Fl_Tooltip::color_);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)Fl_Tooltip::textcolor_);
  uVar1 = Fl_Tooltip::size_;
  if (Fl_Tooltip::size_ == -1) {
    uVar1 = FL_NORMAL_SIZE;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)Fl_Tooltip::font_,(ulong)uVar1);
  fl_draw(tip,3,3,(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                  .super_Fl_Widget.w_ + -6,
          (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
          super_Fl_Widget.h_ + -6,0x84,(Fl_Image *)0x0,1);
  return;
}

Assistant:

void Fl_TooltipBox::draw() {
  draw_box(FL_BORDER_BOX, 0, 0, w(), h(), Fl_Tooltip::color());
  fl_color(Fl_Tooltip::textcolor());
  fl_font(Fl_Tooltip::font(), Fl_Tooltip::size());
  int X = Fl_Tooltip::margin_width();
  int Y = Fl_Tooltip::margin_height();
  int W = w() - (Fl_Tooltip::margin_width()*2);
  int H = h() - (Fl_Tooltip::margin_height()*2);
  fl_draw(tip, X, Y, W, H, Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_WRAP), 0, draw_symbols_);
}